

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::GetInstallObjectNames
          (cmInstallTargetGenerator *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *objects)

{
  long *plVar1;
  long *plVar2;
  pointer this_00;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  string *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  local_78 = config;
  cmGeneratorTarget::GetTargetObjectNames(this->Target,config,objects);
  this_00 = (objects->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (this_00 !=
      (objects->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      computeInstallObjectDir(&local_50,this->Target,local_78);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_88 = *plVar2;
        lStack_80 = plVar1[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar2;
        local_98 = (long *)*plVar1;
      }
      local_90 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_98,(ulong)(this_00->_M_dataplus)._M_p);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_60 = *plVar2;
        lStack_58 = plVar1[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar2;
        local_70 = (long *)*plVar1;
      }
      local_68 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             (objects->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::GetInstallObjectNames(
  std::string const& config, std::vector<std::string>& objects) const
{
  this->Target->GetTargetObjectNames(config, objects);
  for (std::vector<std::string>::iterator i = objects.begin();
       i != objects.end(); ++i) {
    *i = computeInstallObjectDir(this->Target, config) + "/" + *i;
  }
}